

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

XMLElement * CMU462::Collada::ColladaParser::get_technique_cmu462(XMLElement *xml)

{
  bool bVar1;
  XMLElement *pXVar2;
  char *__s;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string profile;
  allocator<char> local_41;
  string local_40;
  XMLElement *local_20;
  XMLElement *technique;
  XMLElement *xml_local;
  
  technique = xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"extra/technique",&local_41);
  pXVar2 = get_element(xml,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pXVar2;
  do {
    if (local_20 == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    __s = tinyxml2::XMLElement::Attribute(local_20,"profile",(char *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,__s,&local_79);
    std::allocator<char>::~allocator(&local_79);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"CMU462");
    if (bVar1) {
      xml_local = local_20;
    }
    else {
      local_20 = tinyxml2::XMLNode::NextSiblingElement(&local_20->super_XMLNode,"technique");
    }
    std::__cxx11::string::~string((string *)local_78);
  } while (!bVar1);
  return xml_local;
}

Assistant:

XMLElement* ColladaParser::get_technique_cmu462( XMLElement* xml ) {

  XMLElement* technique = get_element(xml, "extra/technique");
  while (technique) {
    string profile = technique->Attribute("profile");
    if (profile == "CMU462") return technique;
    technique = technique->NextSiblingElement("technique");
  }

	return NULL;

}